

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O1

char * __thiscall
Debug::PosixCrashHandler::dlDemangle
          (PosixCrashHandler *this,void *addr,char *symbol,int frameIndex,char *stackMemory)

{
  int iVar1;
  char *pcVar2;
  char *allocated;
  int status;
  size_t length;
  Dl_info info;
  
  iVar1 = dladdr(addr,&info);
  if (iVar1 == 0) {
    stackMemory = (char *)0x0;
  }
  else {
    stackMemory[0x1000] = '\0';
    if ((info.dli_sname == (char *)0x0) || (*info.dli_sname != '_')) {
      pcVar2 = "%-3d %*p %s\n";
    }
    else {
      status = -1;
      length = 0x2800;
      pcVar2 = (char *)__cxa_demangle(info.dli_sname,this->m_demangleMemory,&length,&status);
      if (status == 0) {
        this->m_demangleMemory = pcVar2;
      }
      if (info.dli_sname != (char *)0x0) {
        symbol = info.dli_sname;
      }
      if (status == 0) {
        symbol = pcVar2;
      }
      pcVar2 = "%-3d %*p %s + %zd\n";
    }
    snprintf(stackMemory,0x1000,pcVar2,(ulong)(uint)frameIndex,0x12,addr,symbol);
  }
  return stackMemory;
}

Assistant:

char *PosixCrashHandler::dlDemangle(void *addr, char *symbol, int frameIndex, char *stackMemory) {
        Dl_info info;
        if (dladdr(addr, &info) != 0) {
            const int stackFrameSize = 4096;
            char *stackFrame = fake_alloc(&stackMemory, stackFrameSize);

            if ((info.dli_sname != NULL) && (info.dli_sname[0] == '_')) {
                int status = -1;
                size_t length = DEMANGLE_MEMORY_SIZE;
                char *demangled = abi::__cxa_demangle(info.dli_sname, m_demangleMemory, &length, &status);
                if (status == 0) { m_demangleMemory = demangled; }

                snprintf(stackFrame, stackFrameSize, "%-3d %*p %s + %zd\n",
                         frameIndex, int(2 + sizeof(void*) * 2), addr,
                         status == 0 ? demangled :
                                       info.dli_sname == 0 ? symbol : info.dli_sname,
                         (char *)addr - (char *)info.dli_saddr);

            } else {
                snprintf(stackFrame, stackFrameSize, "%-3d %*p %s\n",
                         frameIndex, int(2 + sizeof(void*) * 2), addr, symbol);
            }

            return stackFrame;
        }

        return NULL;
    }